

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall
wallet::CWallet::ImportScripts
          (CWallet *this,set<CScript,_std::less<CScript>,_std::allocator<CScript>_> scripts,
          int64_t timestamp)

{
  long lVar1;
  bool bVar2;
  LegacyScriptPubKeyMan *this_00;
  long in_FS_OFFSET;
  _Rep_type in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = GetLegacyScriptPubKeyMan(this);
  if (this_00 == (LegacyScriptPubKeyMan *)0x0) {
    bVar2 = false;
  }
  else {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&stack0xffffffffffffffa0,
               &(this_00->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore,
               "spk_man->cs_KeyStore",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
               ,0x6e9,false);
    std::
    _Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
    ::_Rb_tree((_Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
                *)&stack0xffffffffffffffb0,
               (_Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
                *)timestamp);
    bVar2 = LegacyScriptPubKeyMan::ImportScripts
                      (this_00,(set<CScript,_std::less<CScript>,_std::allocator<CScript>_>)
                               in_stack_ffffffffffffff98._M_impl,(int64_t)&stack0xffffffffffffffb0);
    std::
    _Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
    ::~_Rb_tree((_Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
                 *)&stack0xffffffffffffffb0);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::ImportScripts(const std::set<CScript> scripts, int64_t timestamp)
{
    auto spk_man = GetLegacyScriptPubKeyMan();
    if (!spk_man) {
        return false;
    }
    LOCK(spk_man->cs_KeyStore);
    return spk_man->ImportScripts(scripts, timestamp);
}